

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_uri_boolean(char *zFilename,char *zParam,int bDflt)

{
  u8 uVar1;
  char *z;
  bool bVar2;
  
  z = sqlite3_uri_parameter(zFilename,zParam);
  bVar2 = bDflt != 0;
  if (z != (char *)0x0) {
    uVar1 = getSafetyLevel(z,1,bDflt != 0);
    bVar2 = uVar1 != '\0';
  }
  return (int)bVar2;
}

Assistant:

SQLITE_API int sqlite3_uri_boolean(const char *zFilename, const char *zParam, int bDflt){
  const char *z = sqlite3_uri_parameter(zFilename, zParam);
  bDflt = bDflt!=0;
  return z ? sqlite3GetBoolean(z, bDflt) : bDflt;
}